

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlBufferPtr xmlBufferCreateSize(size_t size)

{
  uint uVar1;
  xmlBufferPtr pxVar2;
  xmlBufferAllocationScheme *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  
  if (size < 0xffffffff) {
    pxVar2 = (xmlBufferPtr)(*xmlMalloc)(0x20);
    if (pxVar2 != (xmlBufferPtr)0x0) {
      pxVar2->use = 0;
      pxVar3 = __xmlBufferAllocScheme();
      pxVar2->alloc = *pxVar3;
      uVar1 = (int)size + 1;
      uVar5 = 0;
      if (size != 0) {
        uVar5 = uVar1;
      }
      pxVar2->size = uVar5;
      if (size == 0) {
        pxVar2->content = (xmlChar *)0x0;
      }
      else {
        pxVar4 = (xmlChar *)(*xmlMallocAtomic)((size_t)uVar1);
        pxVar2->content = pxVar4;
        if (pxVar4 == (xmlChar *)0x0) {
          xmlTreeErrMemory("creating buffer");
          (*xmlFree)(pxVar2);
          return (xmlBufferPtr)0x0;
        }
        *pxVar4 = '\0';
      }
      pxVar2->contentIO = (xmlChar *)0x0;
      return pxVar2;
    }
    xmlTreeErrMemory("creating buffer");
  }
  return (xmlBufferPtr)0x0;
}

Assistant:

xmlBufferPtr
xmlBufferCreateSize(size_t size) {
    xmlBufferPtr ret;

    if (size >= UINT_MAX)
        return(NULL);
    ret = (xmlBufferPtr) xmlMalloc(sizeof(xmlBuffer));
    if (ret == NULL) {
	xmlTreeErrMemory("creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->alloc = xmlBufferAllocScheme;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */
    if (ret->size){
        ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
        if (ret->content == NULL) {
	    xmlTreeErrMemory("creating buffer");
            xmlFree(ret);
            return(NULL);
        }
        ret->content[0] = 0;
    } else
	ret->content = NULL;
    ret->contentIO = NULL;
    return(ret);
}